

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O2

Aig_Obj_t * Abc_NtkConstructAig_rec(Mfs_Man_t *p,Abc_Obj_t *pNode,Aig_Man_t *pMan)

{
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int *piVar4;
  Abc_Obj_t *pObjOld;
  Aig_Obj_t *p1;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  for (iVar6 = 0; iVar6 < p->vSupp->nSize; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(p->vSupp,iVar6);
    pAVar3 = Aig_ObjCreateCi(pMan);
    *(Aig_Obj_t **)((long)pvVar2 + 8) = pAVar3;
    *(Aig_Obj_t **)((long)pvVar2 + 0x40) = pAVar3;
  }
  pAVar1 = pNode->pNtk;
  if ((pAVar1->vTravIds).pArray == (int *)0x0) {
    uVar8 = (long)pAVar1->vObjs->nSize + 500;
    uVar7 = 0;
    iVar6 = (int)uVar8;
    if ((pAVar1->vTravIds).nCap < iVar6) {
      piVar4 = (int *)malloc(uVar8 * 4);
      (pAVar1->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar1->vTravIds).nCap = iVar6;
    }
    else {
      piVar4 = (int *)0x0;
    }
    uVar5 = 0;
    if (0 < iVar6) {
      uVar5 = uVar8 & 0xffffffff;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      piVar4[uVar7] = 0;
    }
    (pAVar1->vTravIds).nSize = iVar6;
  }
  iVar6 = pAVar1->nTravIds;
  pAVar1->nTravIds = iVar6 + 1;
  if (iVar6 < 0x3fffffff) {
    for (iVar6 = 0; iVar6 < p->vNodes->nSize; iVar6 = iVar6 + 1) {
      pObjOld = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,iVar6);
      Abc_MfsConvertHopToAig(pObjOld,pMan);
      if (pObjOld == pNode) {
        *(byte *)&pObjOld->pNext = *(byte *)&pObjOld->pNext ^ 1;
      }
    }
    pAVar3 = (Aig_Obj_t *)((ulong)pMan->pConst1 ^ 1);
    for (iVar6 = 0; iVar6 < p->vRoots->nSize; iVar6 = iVar6 + 1) {
      pvVar2 = Vec_PtrEntry(p->vRoots,iVar6);
      p1 = Aig_Exor(pMan,*(Aig_Obj_t **)((long)pvVar2 + 0x40),*(Aig_Obj_t **)((long)pvVar2 + 8));
      pAVar3 = Aig_Or(pMan,pAVar3,p1);
    }
    return pAVar3;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Aig_Obj_t * Abc_NtkConstructAig_rec( Mfs_Man_t * p, Abc_Obj_t * pNode, Aig_Man_t * pMan )
{
    Aig_Obj_t * pRoot, * pExor;
    Abc_Obj_t * pObj;
    int i;
    // assign AIG nodes to the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pObj, i )
        pObj->pCopy = pObj->pNext = (Abc_Obj_t *)Aig_ObjCreateCi( pMan );
    // strash intermediate nodes
    Abc_NtkIncrementTravId( pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        Abc_MfsConvertHopToAig( pObj, pMan );
        if ( pObj == pNode )
            pObj->pNext = Abc_ObjNot(pObj->pNext);
    }
    // create the observability condition
    pRoot = Aig_ManConst0(pMan);
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        pExor = Aig_Exor( pMan, (Aig_Obj_t *)pObj->pCopy, (Aig_Obj_t *)pObj->pNext );
        pRoot = Aig_Or( pMan, pRoot, pExor );
    }
    return pRoot;
}